

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomType.cpp
# Opt level: O0

vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> * __thiscall
OpenMD::AtomType::allYourBase(AtomType *this)

{
  long in_RSI;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *in_RDI;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *myChain;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *in_stack_ffffffffffffff68;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *in_stack_ffffffffffffff70;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *this_00;
  const_iterator in_stack_ffffffffffffff78;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *this_01;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> local_30;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar1;
  
  uVar1 = 0;
  this_01 = in_RDI;
  std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::vector
            ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)0x282b6e);
  if ((*(byte *)(in_RSI + 0x38) & 1) == 0) {
    std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::push_back
              (in_stack_ffffffffffffff70,(value_type *)in_stack_ffffffffffffff68);
  }
  else {
    allYourBase((AtomType *)CONCAT17(uVar1,in_stack_ffffffffffffffe8));
    this_00 = &local_30;
    std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::operator=
              (this_01,(vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                       in_stack_ffffffffffffff78._M_current);
    std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::~vector(this_01);
    std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::begin
              (in_stack_ffffffffffffff68);
    __gnu_cxx::
    __normal_iterator<OpenMD::AtomType*const*,std::vector<OpenMD::AtomType*,std::allocator<OpenMD::AtomType*>>>
    ::__normal_iterator<OpenMD::AtomType**>
              ((__normal_iterator<OpenMD::AtomType_*const_*,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                *)this_00,
               (__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                *)in_stack_ffffffffffffff68);
    std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::insert
              (this_00,in_stack_ffffffffffffff78,(value_type *)in_stack_ffffffffffffff68);
  }
  return in_RDI;
}

Assistant:

std::vector<AtomType*> AtomType::allYourBase() {
    std::vector<AtomType*> myChain;

    if (hasBase_) {
      myChain = base_->allYourBase();
      myChain.insert(myChain.begin(), this);
    } else {
      myChain.push_back(this);
    }

    return myChain;
  }